

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O2

TextDisplayer * TextDisplayer::getInstance(void)

{
  TextDisplayer *this;
  
  if (textDisplayer == (TextDisplayer *)0x0) {
    this = (TextDisplayer *)operator_new(0x18);
    TextDisplayer(this);
    textDisplayer = this;
  }
  return textDisplayer;
}

Assistant:

TextDisplayer* TextDisplayer::getInstance() {
    if (textDisplayer == nullptr) {
        textDisplayer = new TextDisplayer();
    }
    return textDisplayer;
}